

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

void platform_ssh_share_cleanup(char *name)

{
  char *in_RAX;
  char *s1;
  char *pcVar1;
  char *logtext;
  char *local_18;
  
  local_18 = in_RAX;
  s1 = make_dirname(name,&local_18);
  if (s1 != (char *)0x0) {
    pcVar1 = dupcat_fn(s1,"/socket",0);
    remove(pcVar1);
    safefree(pcVar1);
    pcVar1 = dupcat_fn(s1,"/lock",0);
    remove(pcVar1);
    safefree(pcVar1);
    rmdir(s1);
    local_18 = s1;
  }
  safefree(local_18);
  return;
}

Assistant:

void platform_ssh_share_cleanup(const char *name)
{
    char *dirname, *filename, *logtext;

    dirname = make_dirname(name, &logtext);
    if (!dirname) {
        sfree(logtext);                /* we can't do much with this */
        return;
    }

    filename = dupcat(dirname, "/socket");
    remove(filename);
    sfree(filename);

    filename = dupcat(dirname, "/lock");
    remove(filename);
    sfree(filename);

    rmdir(dirname);

    /*
     * We deliberately _don't_ clean up the parent directory
     * /tmp/putty-connshare.<username>, because if we leave it around
     * then it reduces the ability for other users to be a nuisance by
     * putting their own directory in the way of it. Also, the salt
     * file in it can be reused.
     */

    sfree(dirname);
}